

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O3

void __thiscall
QHashPrivate::Span<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_>::moveFromSpan
          (Span<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_> *this,
          Span<QHashPrivate::Node<QPersistentModelIndex,_QHashDummyValue>_> *fromSpan,
          size_t fromIndex,size_t to)

{
  byte bVar1;
  byte bVar2;
  Entry *pEVar3;
  Entry *pEVar4;
  uchar uVar5;
  
  uVar5 = this->nextFree;
  if (uVar5 == this->allocated) {
    addStorage(this);
    uVar5 = this->nextFree;
  }
  this->offsets[to] = uVar5;
  pEVar3 = this->entries;
  bVar1 = this->nextFree;
  this->nextFree = pEVar3[bVar1].storage.data[0];
  bVar2 = fromSpan->offsets[fromIndex];
  fromSpan->offsets[fromIndex] = 0xff;
  pEVar4 = fromSpan->entries;
  *(undefined8 *)pEVar3[bVar1].storage.data = *(undefined8 *)pEVar4[bVar2].storage.data;
  pEVar4[bVar2].storage.data[0] = fromSpan->nextFree;
  fromSpan->nextFree = bVar2;
  return;
}

Assistant:

void moveFromSpan(Span &fromSpan, size_t fromIndex, size_t to) noexcept(std::is_nothrow_move_constructible_v<Node>)
    {
        Q_ASSERT(to < SpanConstants::NEntries);
        Q_ASSERT(offsets[to] == SpanConstants::UnusedEntry);
        Q_ASSERT(fromIndex < SpanConstants::NEntries);
        Q_ASSERT(fromSpan.offsets[fromIndex] != SpanConstants::UnusedEntry);
        if (nextFree == allocated)
            addStorage();
        Q_ASSERT(nextFree < allocated);
        offsets[to] = nextFree;
        Entry &toEntry = entries[nextFree];
        nextFree = toEntry.nextFree();

        size_t fromOffset = fromSpan.offsets[fromIndex];
        fromSpan.offsets[fromIndex] = SpanConstants::UnusedEntry;
        Entry &fromEntry = fromSpan.entries[fromOffset];

        if constexpr (isRelocatable<Node>()) {
            memcpy(&toEntry, &fromEntry, sizeof(Entry));
        } else {
            new (&toEntry.node()) Node(std::move(fromEntry.node()));
            fromEntry.node().~Node();
        }
        fromEntry.nextFree() = fromSpan.nextFree;
        fromSpan.nextFree = static_cast<unsigned char>(fromOffset);
    }